

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# DTDElementDecl.cpp
# Opt level: O2

void __thiscall xercesc_4_0::DTDElementDecl::~DTDElementDecl(DTDElementDecl *this)

{
  RefHashTableOf<xercesc_4_0::DTDAttDef,_xercesc_4_0::StringHasher> *this_00;
  MemoryManager *pMVar1;
  void *in_RSI;
  
  (this->super_XMLElementDecl).super_XSerializable._vptr_XSerializable =
       (_func_int **)&PTR__DTDElementDecl_00406fc0;
  this_00 = this->fAttDefs;
  if (this_00 != (RefHashTableOf<xercesc_4_0::DTDAttDef,_xercesc_4_0::StringHasher> *)0x0) {
    RefHashTableOf<xercesc_4_0::DTDAttDef,_xercesc_4_0::StringHasher>::~RefHashTableOf(this_00);
  }
  XMemory::operator_delete((XMemory *)this_00,in_RSI);
  if (this->fAttList != (DTDAttDefList *)0x0) {
    (*(this->fAttList->super_XMLAttDefList).super_XSerializable._vptr_XSerializable[1])();
  }
  if (this->fContentSpec != (ContentSpecNode *)0x0) {
    (*(this->fContentSpec->super_XSerializable)._vptr_XSerializable[1])();
  }
  if (this->fContentModel != (XMLContentModel *)0x0) {
    (*this->fContentModel->_vptr_XMLContentModel[1])();
  }
  pMVar1 = (this->super_XMLElementDecl).fMemoryManager;
  (*pMVar1->_vptr_MemoryManager[4])(pMVar1,this->fFormattedModel);
  XMLElementDecl::~XMLElementDecl(&this->super_XMLElementDecl);
  return;
}

Assistant:

DTDElementDecl::~DTDElementDecl()
{
    delete fAttDefs;
    delete fAttList;
    delete fContentSpec;
    delete fContentModel;
    getMemoryManager()->deallocate(fFormattedModel);//delete [] fFormattedModel;
}